

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

void run::run_node(Node *n,Program *p,VM *vm)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  uint *puVar5;
  size_type sVar6;
  reference pvVar7;
  reference ppSVar8;
  undefined8 uVar9;
  undefined1 local_f8 [8];
  Parser parser;
  LexData *lex_data;
  FunctionNode *f;
  Stmt *stmt;
  iterator __end3;
  iterator __begin3;
  vector<Stmt_*,_std::allocator<Stmt_*>_> *__range3;
  CompoundStmt *e;
  Return *r;
  Literal *l;
  int y;
  int x;
  BinExpr *be;
  UnaryExpr *ue;
  VM *vm_local;
  Program *p_local;
  Node *n_local;
  
  switch(n->kind) {
  case UnaryExpr:
    run_node((Node *)n[1]._vptr_Node,p,vm);
    bVar4 = std::vector<int,_std::allocator<int>_>::empty(&vm->stack);
    if (!bVar4) {
      cVar1 = n->field_0xc;
      if (cVar1 == '!') {
        pvVar7 = std::vector<int,_std::allocator<int>_>::back(&vm->stack);
        iVar3 = *pvVar7;
        puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::back(&vm->stack);
        *puVar5 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
      }
      else if (((cVar1 != '&') && (cVar1 != '*')) && (cVar1 != '+')) {
        if (cVar1 == '-') {
          pvVar7 = std::vector<int,_std::allocator<int>_>::back(&vm->stack);
          iVar3 = *pvVar7;
          pvVar7 = std::vector<int,_std::allocator<int>_>::back(&vm->stack);
          *pvVar7 = -iVar3;
        }
        else if (cVar1 == '~') {
          puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::back(&vm->stack);
          uVar2 = *puVar5;
          puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::back(&vm->stack);
          *puVar5 = uVar2 ^ 0xffffffff;
        }
      }
    }
    break;
  case BinExpr:
    run_node((Node *)n[1]._vptr_Node,p,vm);
    run_node(*(Node **)&n[1].kind,p,vm);
    sVar6 = std::vector<int,_std::allocator<int>_>::size(&vm->stack);
    if (1 < sVar6) {
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&vm->stack);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&vm->stack,sVar6 - 2);
      l._4_4_ = *pvVar7;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&vm->stack);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&vm->stack,sVar6 - 1);
      iVar3 = *pvVar7;
      switch(n->field_0xc) {
      case 0x25:
        l._4_4_ = l._4_4_ % iVar3;
        break;
      case 0x2a:
        l._4_4_ = iVar3 * l._4_4_;
        break;
      case 0x2b:
        l._4_4_ = iVar3 + l._4_4_;
        break;
      case 0x2d:
        l._4_4_ = l._4_4_ - iVar3;
        break;
      case 0x2f:
        l._4_4_ = l._4_4_ / iVar3;
      }
      std::vector<int,_std::allocator<int>_>::pop_back(&vm->stack);
      pvVar7 = std::vector<int,_std::allocator<int>_>::back(&vm->stack);
      *pvVar7 = l._4_4_;
    }
    break;
  case Literal:
    std::vector<int,_std::allocator<int>_>::push_back
              (&vm->stack,(value_type_conflict3 *)&n->field_0xc);
    break;
  case Return:
    if (n[1]._vptr_Node != (_func_int **)0x0) {
      run_node((Node *)n[1]._vptr_Node,p,vm);
    }
    break;
  case CompoundStmt:
    __end3 = std::vector<Stmt_*,_std::allocator<Stmt_*>_>::begin
                       ((vector<Stmt_*,_std::allocator<Stmt_*>_> *)(n + 1));
    stmt = (Stmt *)std::vector<Stmt_*,_std::allocator<Stmt_*>_>::end
                             ((vector<Stmt_*,_std::allocator<Stmt_*>_> *)(n + 1));
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<Stmt_**,_std::vector<Stmt_*,_std::allocator<Stmt_*>_>_>
                                       *)&stmt), bVar4) {
      ppSVar8 = __gnu_cxx::__normal_iterator<Stmt_**,_std::vector<Stmt_*,_std::allocator<Stmt_*>_>_>
                ::operator*(&__end3);
      run_node(&(*ppSVar8)->super_Node,p,vm);
      __gnu_cxx::__normal_iterator<Stmt_**,_std::vector<Stmt_*,_std::allocator<Stmt_*>_>_>::
      operator++(&__end3);
    }
    break;
  case Function:
    parser._112_8_ =
         std::vector<LexData,_std::allocator<LexData>_>::operator[]
                   (&p->lex_data,(long)*(int *)(*(long *)&n[3].kind + 0xc));
    if (*(long *)(*(long *)&n[3].kind + 0x18) == 0) {
      Parser::Parser((Parser *)local_f8,0);
      Parser::parse_function_body((Parser *)local_f8,(LexData *)parser._112_8_,(FunctionNode *)n);
      if (*(long *)(*(long *)&n[3].kind + 0x18) == 0) {
        uVar9 = std::__cxx11::string::c_str();
        printf("error parsing %s() function body",uVar9);
        exit(1);
      }
      Parser::~Parser((Parser *)local_f8);
    }
    run_node(*(Node **)(*(long *)&n[3].kind + 0x18),p,vm);
  }
  return;
}

Assistant:

static void run_node(
  Node* n,
  Program& p,
  VM& vm)
{
  switch (n->kind) {

    case NodeKind::UnaryExpr: {
      auto ue = static_cast<UnaryExpr*>(n);
      run_node(ue->operand, p, vm);
      if (!vm.stack.empty()) {
        switch (ue->op) {
          case '*': break; // TODO
          case '&': break; // TODO
          case '+': break;
          case '-': vm.stack.back() = -vm.stack.back(); break;
          case '!': vm.stack.back() = !vm.stack.back(); break;
          case '~': vm.stack.back() = ~vm.stack.back(); break;
        }
      }
      break;
    }

    case NodeKind::BinExpr: {
      auto be = static_cast<BinExpr*>(n);
      run_node(be->lhs, p, vm);
      run_node(be->rhs, p, vm);

      if (vm.stack.size() >= 2) {
        int x = vm.stack[vm.stack.size()-2];
        int y = vm.stack[vm.stack.size()-1];

        switch (be->op) {
          case '+': x += y; break;
          case '-': x -= y; break;
          case '*': x *= y; break;
          case '/': x /= y; break;
          case '%': x %= y; break;
        }

        vm.stack.pop_back();
        vm.stack.back() = x;
      }
      break;
    }

    case NodeKind::Literal: {
      auto l = static_cast<Literal*>(n);
      vm.stack.push_back(l->value);
      break;
    }

    case NodeKind::Return: {
      auto r = static_cast<Return*>(n);
      // Run the return expression (the result should be left in the stack)
      if (r->expr)
        run_node(r->expr, p, vm);
      break;
    }

    case NodeKind::CompoundStmt: {
      auto e = static_cast<CompoundStmt*>(n);
      for (Stmt* stmt : e->stmts) {
        run_node(stmt, p, vm);
      }
      break;
    }

    case NodeKind::Function: {
      auto f = static_cast<FunctionNode*>(n);
      const LexData& lex_data = p.lex_data[f->body->lex_i];

      // Parse function that was just fast-parsed (only tokens)
      if (!f->body->block) {
        Parser parser;
        parser.parse_function_body(lex_data, f);

        if (!f->body->block) {
          std::printf("error parsing %s() function body", f->name.c_str());
          std::exit(1);
        }
      }

      run_node(f->body->block, p, vm);
      break;
    }

  }
}